

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecExtract(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars,Abc_Obj_t *pPivot,Vec_Int_t *vRoots,
                  Vec_Int_t *vGates,Vec_Wec_t *vFanins,Vec_Int_t *vMap,Vec_Int_t *vTfi,
                  Vec_Int_t *vTfo,Vec_Int_t *vMffc,Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,
                  Sfm_Mit_t *pMit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar6;
  word wVar7;
  Sfm_Dec_t *pSVar8;
  bool local_199;
  bool local_151;
  bool local_121;
  bool local_101;
  int nOldSize_1;
  int nDivsNew_1;
  int nOldSize;
  int nDivsNew;
  int nDivs;
  int nTfiSize;
  int k;
  int i;
  int nLevelMin;
  int nLevelMax;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vLevel;
  int fVeryVerbose;
  Vec_Wec_t *vFanins_local;
  Vec_Int_t *vGates_local;
  Vec_Int_t *vRoots_local;
  Abc_Obj_t *pPivot_local;
  Sfm_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  uVar4 = *(uint *)&pPivot->field_0x14;
  iVar3 = pPars->nTfoLevMax;
  iVar1 = (*(uint *)&pPivot->field_0x14 >> 0xc) - pPars->nTfiLevMax;
  iVar2 = Abc_ObjIsNode(pPivot);
  if (iVar2 == 0) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x625,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  Vec_IntClear(vTfo);
  Abc_NtkIncrementTravId(pNtk);
  Abc_NtkDfsReverseOne_rec(pPivot,vTfo,(uVar4 >> 0xc) + iVar3,pPars->nFanoutMax);
  for (nTfiSize = 0; iVar3 = Vec_IntSize(vTfo), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
    iVar3 = Vec_IntEntry(vTfo,nTfiSize);
    pAVar5 = Abc_NtkObj(pNtk,iVar3);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      for (nDivs = 0; iVar3 = Abc_ObjFaninNum(pAVar5), nDivs < iVar3; nDivs = nDivs + 1) {
        pAVar6 = Abc_ObjFanin(pAVar5,nDivs);
        (pAVar6->field_6).iTemp = (pAVar6->field_6).iTemp + 1;
      }
    }
  }
  Vec_IntClear(vRoots);
  for (nTfiSize = 0; iVar3 = Vec_IntSize(vTfo), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
    iVar3 = Vec_IntEntry(vTfo,nTfiSize);
    pAVar5 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar5 != (Abc_Obj_t *)0x0) &&
       (iVar3 = (pAVar5->field_6).iTemp, iVar2 = Abc_ObjFanoutNum(pAVar5), iVar3 != iVar2)) {
      uVar4 = Abc_ObjId(pAVar5);
      Vec_IntPush(vRoots,uVar4);
    }
  }
  iVar3 = Vec_IntSize(vRoots);
  if (iVar3 < 1) {
    __assert_fail("Vec_IntSize(vRoots) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x635,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  Vec_IntClear(vTfi);
  Abc_NtkIncrementTravId(pNtk);
  Abc_NtkDfsOne_rec(pPivot,vTfi,iVar1,1);
  iVar3 = Vec_IntSize(vTfi);
  Sfm_ObjFlipNode(pPivot);
  Sfm_DecMarkMffc(pPivot,iVar1,pPars->nMffcMax,0,vMffc,vInMffc,pTim,pMit);
  iVar2 = Vec_IntSize(vMffc);
  if (pPars->nMffcMax < iVar2) {
    __assert_fail("Vec_IntSize(vMffc) <= pPars->nMffcMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x63e,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  for (nTfiSize = 0; iVar2 = Vec_IntSize(vRoots), nTfiSize < iVar2; nTfiSize = nTfiSize + 1) {
    iVar2 = Vec_IntEntry(vRoots,nTfiSize);
    pAVar5 = Abc_NtkObj(pNtk,iVar2);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      Abc_NtkDfsOne_rec(pAVar5,vTfi,iVar1,2);
    }
  }
  while (nTfiSize = iVar3, iVar3 = Vec_IntSize(vTfi), nTfiSize < iVar3) {
    iVar3 = Vec_IntEntry(vTfi,nTfiSize);
    pAVar5 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && ((pAVar5->field_6).iTemp != 2)) {
      for (nDivs = 0; iVar3 = Abc_ObjFaninNum(pAVar5), nDivs < iVar3; nDivs = nDivs + 1) {
        pAVar6 = Abc_ObjFanin(pAVar5,nDivs);
        if ((pAVar6->field_6).iTemp == 2) {
          (pAVar6->field_6).iTemp = 4;
        }
      }
    }
    iVar3 = nTfiSize + 1;
  }
  Vec_IntClear(vMap);
  Vec_IntClear(vGates);
  for (nTfiSize = 0; iVar3 = Vec_IntSize(vTfi), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
    iVar3 = Vec_IntEntry(vTfi,nTfiSize);
    pAVar5 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && ((pAVar5->field_6).iTemp == 1)) {
      iVar3 = Abc_ObjIsCi(pAVar5);
      local_101 = true;
      if (iVar3 == 0) {
        iVar3 = Abc_ObjLevel(pAVar5);
        local_121 = false;
        if (iVar3 < iVar1) {
          iVar3 = Abc_ObjFaninNum(pAVar5);
          local_121 = 0 < iVar3;
        }
        local_101 = local_121;
      }
      Sfm_DecAddNode(pAVar5,vMap,vGates,(uint)local_101,0);
    }
  }
  nOldSize = Vec_IntSize(vMap);
  for (nTfiSize = 0; iVar3 = Vec_IntSize(vTfi), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
    iVar3 = Vec_IntEntry(vTfi,nTfiSize);
    pAVar5 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar5 != (Abc_Obj_t *)0x0) &&
       (((pAVar5->field_6).iTemp == 3 || ((pAVar5->field_6).iTemp == 4)))) {
      Sfm_DecAddNode(pAVar5,vMap,vGates,(uint)((pAVar5->field_6).iTemp == 4),0);
    }
  }
  if (pMit == (Sfm_Mit_t *)0x0) {
    if (pTim != (Sfm_Tim_t *)0x0) {
      iVar3 = Vec_IntSize(vMap);
      Vec_IntClear(vTfo);
      Vec_IntAppend(vTfo,vMap);
      uVar4 = Abc_ObjId(pPivot);
      nOldSize = Sfm_TimSortArrayByArrival(pTim,vTfo,uVar4);
      Vec_IntClear(vMap);
      Vec_IntClear(vGates);
      for (nTfiSize = 0; iVar2 = Vec_IntSize(vTfo), nTfiSize < iVar2; nTfiSize = nTfiSize + 1) {
        iVar2 = Vec_IntEntry(vTfo,nTfiSize);
        pAVar5 = Abc_NtkObj(pNtk,iVar2);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          iVar2 = Abc_ObjIsCi(pAVar5);
          local_199 = true;
          if (iVar2 == 0) {
            iVar2 = Abc_ObjLevel(pAVar5);
            if (iVar2 < iVar1) {
              iVar2 = Abc_ObjFaninNum(pAVar5);
              local_199 = true;
              if (0 < iVar2) goto LAB_00658861;
            }
            local_199 = (pAVar5->field_6).iTemp == 4;
          }
LAB_00658861:
          Sfm_DecAddNode(pAVar5,vMap,vGates,(uint)local_199,0);
        }
      }
      iVar1 = Vec_IntSize(vMap);
      if (iVar3 != iVar1) {
        __assert_fail("nOldSize == Vec_IntSize(vMap)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x674,
                      "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
    }
  }
  else {
    iVar3 = Vec_IntSize(vMap);
    Vec_IntClear(vTfo);
    Vec_IntAppend(vTfo,vMap);
    uVar4 = Abc_ObjId(pPivot);
    nOldSize = Sfm_MitSortArrayByArrival(pMit,vTfo,uVar4);
    Vec_IntClear(vMap);
    Vec_IntClear(vGates);
    for (nTfiSize = 0; iVar2 = Vec_IntSize(vTfo), nTfiSize < iVar2; nTfiSize = nTfiSize + 1) {
      iVar2 = Vec_IntEntry(vTfo,nTfiSize);
      pAVar5 = Abc_NtkObj(pNtk,iVar2);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        iVar2 = Abc_ObjIsCi(pAVar5);
        local_151 = true;
        if (iVar2 == 0) {
          iVar2 = Abc_ObjLevel(pAVar5);
          if (iVar2 < iVar1) {
            iVar2 = Abc_ObjFaninNum(pAVar5);
            local_151 = true;
            if (0 < iVar2) goto LAB_00658680;
          }
          local_151 = (pAVar5->field_6).iTemp == 4;
        }
LAB_00658680:
        Sfm_DecAddNode(pAVar5,vMap,vGates,(uint)local_151,0);
      }
    }
    iVar1 = Vec_IntSize(vMap);
    if (iVar3 != iVar1) {
      __assert_fail("nOldSize == Vec_IntSize(vMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x665,
                    "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                   );
    }
  }
  for (nTfiSize = 0; iVar3 = Vec_IntSize(vTfi), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
    iVar3 = Vec_IntEntry(vTfi,nTfiSize);
    pAVar5 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && (7 < (pAVar5->field_6).iTemp)) {
      Sfm_DecAddNode(pAVar5,vMap,vGates,0,0);
    }
  }
  iVar3 = Vec_IntSize(vMap);
  iVar1 = Vec_IntSize(vGates);
  if (iVar3 == iVar1) {
    Vec_WecClear(vFanins);
    for (nTfiSize = 0; iVar3 = Vec_IntSize(vMap), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
      iVar3 = Vec_IntEntry(vMap,nTfiSize);
      pAVar5 = Abc_NtkObj(pNtk,iVar3);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        (pAVar5->field_6).iTemp = nTfiSize;
        p = Vec_WecPushLevel(vFanins);
        iVar3 = Vec_IntEntry(vGates,nTfiSize);
        if (-1 < iVar3) {
          for (nDivs = 0; iVar3 = Abc_ObjFaninNum(pAVar5), nDivs < iVar3; nDivs = nDivs + 1) {
            pAVar6 = Abc_ObjFanin(pAVar5,nDivs);
            Vec_IntPush(p,(pAVar6->field_6).iTemp);
          }
        }
      }
    }
    wVar7 = Sfm_ObjFindCareSet(pPivot->pNtk,vRoots);
    pSVar8 = Sfm_DecMan(pPivot);
    pSVar8->uCareSet = wVar7;
    for (nTfiSize = 0; iVar3 = Vec_IntSize(vRoots), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
      iVar3 = Vec_IntEntry(vRoots,nTfiSize);
      pAVar5 = Abc_NtkObj(pNtk,iVar3);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        Vec_IntWriteEntry(vRoots,nTfiSize,(pAVar5->field_6).iTemp);
      }
    }
    for (nTfiSize = 0; iVar3 = Vec_IntSize(vInMffc), nTfiSize < iVar3; nTfiSize = nTfiSize + 1) {
      iVar3 = Vec_IntEntry(vInMffc,nTfiSize);
      pAVar5 = Abc_NtkObj(pNtk,iVar3);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        Vec_IntWriteEntry(vInMffc,nTfiSize,(pAVar5->field_6).iTemp);
      }
    }
    return nOldSize;
  }
  __assert_fail("Vec_IntSize(vMap) == Vec_IntSize(vGates)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                ,0x67e,
                "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
               );
}

Assistant:

int Sfm_DecExtract( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars, Abc_Obj_t * pPivot, Vec_Int_t * vRoots, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Int_t * vTfi, Vec_Int_t * vTfo, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    int fVeryVerbose = 0;//pPars->fVeryVerbose;
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj, * pFanin;
    int nLevelMax = pPivot->Level + pPars->nTfoLevMax;
    int nLevelMin = pPivot->Level - pPars->nTfiLevMax;
    int i, k, nTfiSize, nDivs = -1;
    assert( Abc_ObjIsNode(pPivot) );
if ( fVeryVerbose )
printf( "\n\nTarget %d\n", Abc_ObjId(pPivot) );
    // collect TFO nodes
    Vec_IntClear( vTfo );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsReverseOne_rec( pPivot, vTfo, nLevelMax, pPars->nFanoutMax );
    // count internal fanouts
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pFanin->iTemp++;
    // compute roots
    Vec_IntClear( vRoots );
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        if ( pObj->iTemp != Abc_ObjFanoutNum(pObj) )
            Vec_IntPush( vRoots, Abc_ObjId(pObj) );
    assert( Vec_IntSize(vRoots) > 0 );
    // collect TFI and mark nodes
    Vec_IntClear( vTfi );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsOne_rec( pPivot, vTfi, nLevelMin, SFM_MASK_PI );
    nTfiSize = Vec_IntSize(vTfi);
    Sfm_ObjFlipNode( pPivot );
    // additinally mark MFFC
    Sfm_DecMarkMffc( pPivot, nLevelMin, pPars->nMffcMax, fVeryVerbose, vMffc, vInMffc, pTim, pMit );
    assert( Vec_IntSize(vMffc) <= pPars->nMffcMax );
if ( fVeryVerbose )
printf( "Mffc size = %d. Mffc area = %.2f. InMffc size = %d.\n", Vec_IntSize(vMffc), Scl_Int2Flt(Sfm_DecMffcArea(pNtk, vMffc)), Vec_IntSize(vInMffc) );
    // collect TFI(TFO)
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Abc_NtkDfsOne_rec( pObj, vTfi, nLevelMin, SFM_MASK_INPUT );
    // mark input-only nodes pointed to by mixed nodes
    Abc_NtkForEachObjVecStart( vTfi, pNtk, pObj, i, nTfiSize )
        if ( pObj->iTemp != SFM_MASK_INPUT )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pFanin->iTemp == SFM_MASK_INPUT )
                    pFanin->iTemp = SFM_MASK_FANIN;
    // collect nodes supported only on TFI fanins and not MFFC
if ( fVeryVerbose )
printf( "\nDivs:\n" );
    Vec_IntClear( vMap );
    Vec_IntClear( vGates );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == SFM_MASK_PI )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0), fVeryVerbose );
    nDivs = Vec_IntSize(vMap);
    // add other nodes that are not in TFO and not in MFFC
if ( fVeryVerbose )
printf( "\nSides:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == (SFM_MASK_PI | SFM_MASK_INPUT) || pObj->iTemp == SFM_MASK_FANIN )
            Sfm_DecAddNode( pObj, vMap, vGates, pObj->iTemp == SFM_MASK_FANIN, fVeryVerbose );
    // reorder nodes acording to delay
    if ( pMit )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_MitSortArrayByArrival( pMit, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    else if ( pTim )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_TimSortArrayByArrival( pTim, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    // add the TFO nodes
if ( fVeryVerbose )
printf( "\nTFO:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp >= SFM_MASK_MFFC )
            Sfm_DecAddNode( pObj, vMap, vGates, 0, fVeryVerbose );
    assert( Vec_IntSize(vMap) == Vec_IntSize(vGates) );
if ( fVeryVerbose )
printf( "\n" );
    // create node IDs
    Vec_WecClear( vFanins );
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        pObj->iTemp = i;
        vLevel = Vec_WecPushLevel( vFanins );
        if ( Vec_IntEntry(vGates, i) >= 0 )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Vec_IntPush( vLevel, pFanin->iTemp );
    }
    // compute care set
    Sfm_DecMan(pPivot)->uCareSet = Sfm_ObjFindCareSet(pPivot->pNtk, vRoots);

    //printf( "care = %5d : ", Abc_ObjId(pPivot) );
    //Extra_PrintBinary( stdout, (unsigned *)&Sfm_DecMan(pPivot)->uCareSet, 64 );
    //printf( "\n" );

    // remap roots
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Vec_IntWriteEntry( vRoots, i, pObj->iTemp );
    // remap inputs to MFFC
    Abc_NtkForEachObjVec( vInMffc, pNtk, pObj, i )
        Vec_IntWriteEntry( vInMffc, i, pObj->iTemp );

/*
    // check
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        if ( i == nDivs )
            break;
        Abc_NtkIncrementTravId( pNtk );
        assert( Abc_NtkDfsCheck_rec(pObj, pPivot) );
    }
*/  
    return nDivs;
}